

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cram_decode.c
# Opt level: O3

cram_block_compression_hdr * cram_decode_compression_header(cram_fd *fd,cram_block *b)

{
  byte bVar1;
  undefined1 uVar2;
  byte bVar3;
  bool bVar4;
  long lVar5;
  long lVar6;
  int iVar7;
  khint_t kVar8;
  uint uVar9;
  cram_block_compression_hdr *h;
  long lVar10;
  int32_t *piVar11;
  kh_map_t *pkVar12;
  uint *puVar13;
  cram_codec *pcVar14;
  cram_block_compression_hdr *pcVar15;
  uint uVar16;
  ulong uVar17;
  uint uVar18;
  long lVar19;
  cram_encoding cVar20;
  char *key;
  cram_block *cp;
  byte *pbVar21;
  byte *pbVar22;
  int r;
  int local_54;
  byte *local_50;
  byte *local_48;
  cram_block_compression_hdr *local_40;
  cram_block *local_38;
  
  h = (cram_block_compression_hdr *)calloc(1,0x418);
  if (h == (cram_block_compression_hdr *)0x0) {
    return (cram_block_compression_hdr *)0x0;
  }
  if ((b->method == RAW) || (iVar7 = cram_uncompress_block(b), iVar7 == 0)) {
    pbVar22 = b->data;
    local_40 = h;
    if ((fd->version & 0xffffff00U) == 0x100) {
      bVar1 = *pbVar22;
      uVar16 = (uint)bVar1;
      lVar10 = 1;
      if ((char)bVar1 < '\0') {
        uVar18 = (uint)bVar1;
        uVar16 = (uint)pbVar22[1];
        if (bVar1 < 0xc0) {
          uVar16 = (uVar18 & 0x3f) << 8 | uVar16;
          lVar19 = 2;
        }
        else if (bVar1 < 0xe0) {
          uVar16 = (uVar18 & 0x1f) << 0x10 | uVar16 << 8 | (uint)pbVar22[2];
          lVar19 = 3;
        }
        else if (bVar1 < 0xf0) {
          uVar16 = (uVar18 & 0xf) << 0x18 | uVar16 << 0x10 | (uint)pbVar22[2] << 8 |
                   (uint)pbVar22[3];
          lVar19 = 4;
        }
        else {
          uVar16 = pbVar22[4] & 0xf |
                   (uint)pbVar22[3] << 4 | (uint)pbVar22[2] << 0xc | uVar16 << 0x14 | uVar18 << 0x1c
          ;
          lVar19 = 5;
        }
      }
      else {
        lVar19 = 1;
      }
      h->ref_seq_id = uVar16;
      bVar1 = pbVar22[lVar19];
      uVar16 = (uint)bVar1;
      if ((char)bVar1 < '\0') {
        uVar18 = (uint)bVar1;
        uVar16 = (uint)pbVar22[lVar19 + 1];
        if (bVar1 < 0xc0) {
          uVar16 = (uVar18 & 0x3f) << 8 | uVar16;
          lVar10 = 2;
        }
        else if (bVar1 < 0xe0) {
          uVar16 = (uVar18 & 0x1f) << 0x10 | uVar16 << 8 | (uint)pbVar22[lVar19 + 2];
          lVar10 = 3;
        }
        else if (bVar1 < 0xf0) {
          uVar16 = (uVar18 & 0xf) << 0x18 | uVar16 << 0x10 | (uint)pbVar22[lVar19 + 2] << 8 |
                   (uint)pbVar22[lVar19 + 3];
          lVar10 = 4;
        }
        else {
          uVar16 = pbVar22[lVar19 + 4] & 0xf |
                   (uint)pbVar22[lVar19 + 3] << 4 |
                   (uint)pbVar22[lVar19 + 2] << 0xc | uVar16 << 0x14 | uVar18 << 0x1c;
          lVar10 = 5;
        }
      }
      h->ref_seq_start = uVar16;
      lVar5 = lVar10 + lVar19;
      bVar1 = pbVar22[lVar10 + lVar19];
      uVar16 = (uint)bVar1;
      lVar10 = 1;
      if ((char)bVar1 < '\0') {
        uVar18 = (uint)bVar1;
        uVar16 = (uint)pbVar22[lVar5 + 1];
        if (bVar1 < 0xc0) {
          uVar16 = (uVar18 & 0x3f) << 8 | uVar16;
          lVar19 = 2;
        }
        else if (bVar1 < 0xe0) {
          uVar16 = (uVar18 & 0x1f) << 0x10 | uVar16 << 8 | (uint)pbVar22[lVar5 + 2];
          lVar19 = 3;
        }
        else if (bVar1 < 0xf0) {
          uVar16 = (uVar18 & 0xf) << 0x18 | uVar16 << 0x10 | (uint)pbVar22[lVar5 + 2] << 8 |
                   (uint)pbVar22[lVar5 + 3];
          lVar19 = 4;
        }
        else {
          uVar16 = pbVar22[lVar5 + 4] & 0xf |
                   (uint)pbVar22[lVar5 + 3] << 4 |
                   (uint)pbVar22[lVar5 + 2] << 0xc | uVar16 << 0x14 | uVar18 << 0x1c;
          lVar19 = 5;
        }
      }
      else {
        lVar19 = 1;
      }
      h->ref_seq_span = uVar16;
      lVar6 = lVar19 + lVar5;
      bVar1 = pbVar22[lVar19 + lVar5];
      uVar16 = (uint)bVar1;
      if ((char)bVar1 < '\0') {
        uVar18 = (uint)bVar1;
        uVar16 = (uint)pbVar22[lVar6 + 1];
        if (bVar1 < 0xc0) {
          uVar16 = (uVar18 & 0x3f) << 8 | uVar16;
          lVar10 = 2;
        }
        else if (bVar1 < 0xe0) {
          uVar16 = (uVar18 & 0x1f) << 0x10 | uVar16 << 8 | (uint)pbVar22[lVar6 + 2];
          lVar10 = 3;
        }
        else if (bVar1 < 0xf0) {
          uVar16 = (uVar18 & 0xf) << 0x18 | uVar16 << 0x10 | (uint)pbVar22[lVar6 + 2] << 8 |
                   (uint)pbVar22[lVar6 + 3];
          lVar10 = 4;
        }
        else {
          uVar16 = pbVar22[lVar6 + 4] & 0xf |
                   (uint)pbVar22[lVar6 + 3] << 4 |
                   (uint)pbVar22[lVar6 + 2] << 0xc | uVar16 << 0x14 | uVar18 << 0x1c;
          lVar10 = 5;
        }
      }
      h->num_records = uVar16;
      lVar19 = lVar10 + lVar6;
      bVar1 = pbVar22[lVar10 + lVar6];
      uVar16 = (uint)bVar1;
      lVar10 = 1;
      if ((char)bVar1 < '\0') {
        uVar18 = (uint)bVar1;
        uVar16 = (uint)pbVar22[lVar19 + 1];
        if (bVar1 < 0xc0) {
          uVar16 = (uVar18 & 0x3f) << 8 | uVar16;
          lVar10 = 2;
        }
        else if (bVar1 < 0xe0) {
          uVar16 = (uVar18 & 0x1f) << 0x10 | uVar16 << 8 | (uint)pbVar22[lVar19 + 2];
          lVar10 = 3;
        }
        else if (bVar1 < 0xf0) {
          uVar16 = (uVar18 & 0xf) << 0x18 | uVar16 << 0x10 | (uint)pbVar22[lVar19 + 2] << 8 |
                   (uint)pbVar22[lVar19 + 3];
          lVar10 = 4;
        }
        else {
          uVar16 = pbVar22[lVar19 + 4] & 0xf |
                   (uint)pbVar22[lVar19 + 3] << 4 |
                   (uint)pbVar22[lVar19 + 2] << 0xc | uVar16 << 0x14 | uVar18 << 0x1c;
          lVar10 = 5;
        }
      }
      h->num_landmarks = uVar16;
      piVar11 = (int32_t *)malloc((long)(int)uVar16 << 2);
      h->landmark = piVar11;
      if (piVar11 == (int32_t *)0x0) goto LAB_0014043c;
      pbVar22 = pbVar22 + lVar10 + lVar19;
      if (0 < (int)uVar16) {
        uVar17 = 0;
        do {
          bVar1 = *pbVar22;
          uVar18 = (uint)bVar1;
          lVar10 = 1;
          if ((char)bVar1 < '\0') {
            uVar9 = (uint)bVar1;
            uVar18 = (uint)pbVar22[1];
            if (bVar1 < 0xc0) {
              uVar18 = (uVar9 & 0x3f) << 8 | uVar18;
              lVar10 = 2;
            }
            else if (bVar1 < 0xe0) {
              uVar18 = (uVar9 & 0x1f) << 0x10 | uVar18 << 8 | (uint)pbVar22[2];
              lVar10 = 3;
            }
            else if (bVar1 < 0xf0) {
              uVar18 = (uVar9 & 0xf) << 0x18 | uVar18 << 0x10 | (uint)pbVar22[2] << 8 |
                       (uint)pbVar22[3];
              lVar10 = 4;
            }
            else {
              uVar18 = pbVar22[4] & 0xf |
                       (uint)pbVar22[3] << 4 |
                       (uint)pbVar22[2] << 0xc | uVar18 << 0x14 | uVar9 << 0x1c;
              lVar10 = 5;
            }
          }
          piVar11[uVar17] = uVar18;
          pbVar22 = pbVar22 + lVar10;
          uVar17 = uVar17 + 1;
        } while (uVar16 != uVar17);
      }
    }
    lVar10 = 1;
    pkVar12 = (kh_map_t *)calloc(1,0x28);
    h->preservation_map = pkVar12;
    local_40 = (cram_block_compression_hdr *)local_40->rec_encoding_map;
    memset(local_40,0,0x200);
    if (pkVar12 != (kh_map_t *)0x0) {
      h->mapped_qs_included = 0;
      h->unmapped_qs_included = 0;
      h->unmapped_placed = 0;
      h->qs_included = 0;
      h->read_names_included = 0;
      h->AP_delta = 1;
      *(char *)((long)(h->substitution_matrix + 0) + 0) = 'C';
      *(char *)((long)(h->substitution_matrix + 0) + 1) = 'G';
      *(char *)((long)(h->substitution_matrix + 0) + 2) = 'T';
      *(char *)((long)(h->substitution_matrix + 0) + 3) = 'N';
      *(char *)((long)(h->substitution_matrix + 1) + 0) = 'A';
      *(char *)((long)(h->substitution_matrix + 1) + 1) = 'G';
      *(char *)((long)(h->substitution_matrix + 1) + 2) = 'T';
      *(char *)((long)(h->substitution_matrix + 1) + 3) = 'N';
      *(char *)((long)(h->substitution_matrix + 2) + 0) = 'A';
      *(char *)((long)(h->substitution_matrix + 2) + 1) = 'C';
      *(char *)((long)(h->substitution_matrix + 2) + 2) = 'T';
      *(char *)((long)(h->substitution_matrix + 2) + 3) = 'N';
      *(char *)((long)(h->substitution_matrix + 3) + 0) = 'A';
      *(char *)((long)(h->substitution_matrix + 3) + 1) = 'C';
      *(char *)((long)(h->substitution_matrix + 3) + 2) = 'G';
      *(char *)((long)(h->substitution_matrix + 3) + 3) = 'N';
      h->substitution_matrix[4] = (char  [4])0x54474341;
      bVar1 = *pbVar22;
      uVar16 = (uint)bVar1;
      if ((char)bVar1 < '\0') {
        uVar18 = (uint)pbVar22[1];
        if (bVar1 < 0xc0) {
          local_48 = (byte *)CONCAT44(local_48._4_4_,(uVar16 & 0x3f) << 8 | uVar18);
          lVar10 = 2;
        }
        else if (bVar1 < 0xe0) {
          local_48 = (byte *)CONCAT44(local_48._4_4_,
                                      (uVar16 & 0x1f) << 0x10 | uVar18 << 8 | (uint)pbVar22[2]);
          lVar10 = 3;
        }
        else if (bVar1 < 0xf0) {
          local_48 = (byte *)CONCAT44(local_48._4_4_,
                                      (uVar16 & 0xf) << 0x18 | uVar18 << 0x10 |
                                      (uint)pbVar22[2] << 8 | (uint)pbVar22[3]);
          lVar10 = 4;
        }
        else {
          local_48 = (byte *)CONCAT44(local_48._4_4_,
                                      pbVar22[4] & 0xf |
                                      (uint)pbVar22[3] << 4 |
                                      (uint)pbVar22[2] << 0xc | uVar18 << 0x14 | uVar16 << 0x1c);
          lVar10 = 5;
        }
      }
      else {
        local_48 = (byte *)CONCAT44(local_48._4_4_,uVar16);
      }
      local_50 = pbVar22 + lVar10;
      bVar1 = pbVar22[lVar10];
      uVar16 = (uint)bVar1;
      lVar10 = 1;
      if ((char)bVar1 < '\0') {
        uVar18 = (uint)bVar1;
        uVar16 = (uint)local_50[1];
        if (bVar1 < 0xc0) {
          uVar16 = (uVar18 & 0x3f) << 8 | uVar16;
          lVar10 = 2;
        }
        else if (bVar1 < 0xe0) {
          uVar16 = (uVar18 & 0x1f) << 0x10 | uVar16 << 8 | (uint)local_50[2];
          lVar10 = 3;
        }
        else if (bVar1 < 0xf0) {
          uVar16 = (uVar18 & 0xf) << 0x18 | uVar16 << 0x10 | (uint)local_50[2] << 8 |
                   (uint)local_50[3];
          lVar10 = 4;
        }
        else {
          uVar16 = local_50[4] & 0xf |
                   (uint)local_50[3] << 4 |
                   (uint)local_50[2] << 0xc | uVar16 << 0x14 | uVar18 << 0x1c;
          lVar10 = 5;
        }
      }
      pbVar22 = local_50 + lVar10;
      local_38 = b;
      if (0 < (int)uVar16) {
        do {
          cp = (cram_block *)(pbVar22 + 2);
          uVar18 = (int)(char)*pbVar22 << 8 | (int)(char)pbVar22[1];
          if ((int)uVar18 < 0x5252) {
            if ((int)uVar18 < 0x5049) {
              if (uVar18 == 0x4150) {
                uVar2 = (undefined1)cp->method;
                kVar8 = kh_put_map(h->preservation_map,"AP",&local_54);
                if (local_54 == -1) goto LAB_0014175a;
                cp = (cram_block *)((ulong)b & 0xffffffff00000000 | (long)(char)uVar2 & 0xffffffffU)
                ;
                pbVar22 = pbVar22 + 3;
                h->preservation_map->vals[kVar8].p = (char *)cp;
                h->AP_delta = (int)(char)uVar2;
              }
              else if (uVar18 == 0x4d49) {
                uVar2 = (undefined1)cp->method;
                kVar8 = kh_put_map(h->preservation_map,"MI",&local_54);
                if (local_54 == -1) goto LAB_0014175a;
                cp = (cram_block *)((ulong)b & 0xffffffff00000000 | (long)(char)uVar2 & 0xffffffffU)
                ;
                pbVar22 = pbVar22 + 3;
                h->preservation_map->vals[kVar8].p = (char *)cp;
                h->mapped_qs_included = (int)(char)uVar2;
              }
              else {
LAB_00140a48:
                fprintf(_stderr,"Unrecognised preservation map key %c%c\n");
                pbVar22 = pbVar22 + 3;
                cp = b;
              }
            }
            else if (uVar18 == 0x5049) {
              uVar2 = (undefined1)cp->method;
              kVar8 = kh_put_map(h->preservation_map,"PI",&local_54);
              if (local_54 == -1) goto LAB_0014175a;
              cp = (cram_block *)((ulong)b & 0xffffffff00000000 | (long)(char)uVar2 & 0xffffffffU);
              pbVar22 = pbVar22 + 3;
              h->preservation_map->vals[kVar8].p = (char *)cp;
              h->unmapped_placed = (int)(char)uVar2;
            }
            else {
              if (uVar18 != 0x524e) goto LAB_00140a48;
              uVar2 = (undefined1)cp->method;
              kVar8 = kh_put_map(h->preservation_map,"RN",&local_54);
              if (local_54 == -1) goto LAB_0014175a;
              cp = (cram_block *)((ulong)b & 0xffffffff00000000 | (long)(char)uVar2 & 0xffffffffU);
              pbVar22 = pbVar22 + 3;
              h->preservation_map->vals[kVar8].p = (char *)cp;
              h->read_names_included = (int)(char)uVar2;
            }
          }
          else if ((int)uVar18 < 0x5444) {
            if (uVar18 == 0x5252) {
              uVar2 = (undefined1)cp->method;
              kVar8 = kh_put_map(h->preservation_map,"RR",&local_54);
              if (local_54 == -1) goto LAB_0014175a;
              cp = (cram_block *)((ulong)b & 0xffffffff00000000 | (long)(char)uVar2 & 0xffffffffU);
              pbVar22 = pbVar22 + 3;
              h->preservation_map->vals[kVar8].p = (char *)cp;
              fd->no_ref = (uint)(uVar2 == RAW);
            }
            else {
              if (uVar18 != 0x534d) goto LAB_00140a48;
              h->substitution_matrix[0][pbVar22[2] >> 6] = 'C';
              h->substitution_matrix[0][pbVar22[2] >> 4 & 3] = 'G';
              h->substitution_matrix[0][pbVar22[2] >> 2 & 3] = 'T';
              h->substitution_matrix[0][pbVar22[2] & 3] = 'N';
              h->substitution_matrix[1][pbVar22[3] >> 6] = 'A';
              h->substitution_matrix[1][pbVar22[3] >> 4 & 3] = 'G';
              h->substitution_matrix[1][pbVar22[3] >> 2 & 3] = 'T';
              h->substitution_matrix[1][pbVar22[3] & 3] = 'N';
              h->substitution_matrix[2][pbVar22[4] >> 6] = 'A';
              h->substitution_matrix[2][pbVar22[4] >> 4 & 3] = 'C';
              h->substitution_matrix[2][pbVar22[4] >> 2 & 3] = 'T';
              h->substitution_matrix[2][pbVar22[4] & 3] = 'N';
              h->substitution_matrix[3][pbVar22[5] >> 6] = 'A';
              h->substitution_matrix[3][pbVar22[5] >> 4 & 3] = 'C';
              h->substitution_matrix[3][pbVar22[5] >> 2 & 3] = 'G';
              h->substitution_matrix[3][pbVar22[5] & 3] = 'N';
              h->substitution_matrix[4][pbVar22[6] >> 6] = 'A';
              h->substitution_matrix[4][pbVar22[6] >> 4 & 3] = 'C';
              h->substitution_matrix[4][pbVar22[6] >> 2 & 3] = 'G';
              h->substitution_matrix[4][pbVar22[6] & 3] = 'T';
              uVar9 = kh_put_map(h->preservation_map,"SM",&local_54);
              if (local_54 == -1) goto LAB_0014175a;
              pbVar22 = pbVar22 + 7;
LAB_00140a2c:
              h->preservation_map->vals[uVar9].p = (char *)cp;
            }
          }
          else {
            if (uVar18 == 0x5444) {
              uVar18 = cram_decode_TD((char *)cp,h);
              if ((-1 < (int)uVar18) &&
                 (uVar9 = kh_put_map(h->preservation_map,"TD",&local_54), local_54 != -1)) {
                pbVar22 = (byte *)((long)&cp->method + (ulong)uVar18);
                goto LAB_00140a2c;
              }
              goto LAB_0014175a;
            }
            if (uVar18 != 0x5549) goto LAB_00140a48;
            uVar2 = (undefined1)cp->method;
            kVar8 = kh_put_map(h->preservation_map,"UI",&local_54);
            if (local_54 == -1) goto LAB_0014175a;
            cp = (cram_block *)((ulong)b & 0xffffffff00000000 | (long)(char)uVar2 & 0xffffffffU);
            pbVar22 = pbVar22 + 3;
            h->preservation_map->vals[kVar8].p = (char *)cp;
            h->unmapped_qs_included = (int)(char)uVar2;
          }
          uVar16 = uVar16 - 1;
          b = cp;
        } while (uVar16 != 0);
      }
      if ((long)pbVar22 - (long)local_50 == (long)(int)local_48) {
        bVar1 = *pbVar22;
        lVar10 = 1;
        uVar16 = (uint)bVar1;
        if ((char)bVar1 < '\0') {
          uVar18 = (uint)pbVar22[1];
          if (bVar1 < 0xc0) {
            local_50 = (byte *)CONCAT44(local_50._4_4_,(uVar16 & 0x3f) << 8 | uVar18);
            lVar19 = 2;
          }
          else if (bVar1 < 0xe0) {
            local_50 = (byte *)CONCAT44(local_50._4_4_,
                                        (uVar16 & 0x1f) << 0x10 | uVar18 << 8 | (uint)pbVar22[2]);
            lVar19 = 3;
          }
          else if (bVar1 < 0xf0) {
            local_50 = (byte *)CONCAT44(local_50._4_4_,
                                        (uVar16 & 0xf) << 0x18 | uVar18 << 0x10 |
                                        (uint)pbVar22[2] << 8 | (uint)pbVar22[3]);
            lVar19 = 4;
          }
          else {
            local_50 = (byte *)CONCAT44(local_50._4_4_,
                                        pbVar22[4] & 0xf |
                                        (uint)pbVar22[3] << 4 |
                                        (uint)pbVar22[2] << 0xc | uVar18 << 0x14 | uVar16 << 0x1c);
            lVar19 = 5;
          }
        }
        else {
          local_50 = (byte *)CONCAT44(local_50._4_4_,uVar16);
          lVar19 = 1;
        }
        local_48 = pbVar22 + lVar19;
        bVar1 = pbVar22[lVar19];
        uVar16 = (uint)bVar1;
        if ((char)bVar1 < '\0') {
          uVar18 = (uint)bVar1;
          uVar16 = (uint)local_48[1];
          if (bVar1 < 0xc0) {
            uVar16 = (uVar18 & 0x3f) << 8 | uVar16;
            lVar10 = 2;
          }
          else if (bVar1 < 0xe0) {
            uVar16 = (uVar18 & 0x1f) << 0x10 | uVar16 << 8 | (uint)local_48[2];
            lVar10 = 3;
          }
          else if (bVar1 < 0xf0) {
            uVar16 = (uVar18 & 0xf) << 0x18 | uVar16 << 0x10 | (uint)local_48[2] << 8 |
                     (uint)local_48[3];
            lVar10 = 4;
          }
          else {
            uVar16 = local_48[4] & 0xf |
                     (uint)local_48[3] << 4 |
                     (uint)local_48[2] << 0xc | uVar16 << 0x14 | uVar18 << 0x1c;
            lVar10 = 5;
          }
        }
        pbVar21 = local_48 + lVar10;
        pbVar22 = pbVar21;
        if (0 < (int)uVar16) {
          do {
            puVar13 = (uint *)malloc(0x20);
            if (puVar13 == (uint *)0x0) goto LAB_0014175a;
            bVar1 = pbVar22[2];
            cVar20 = (cram_encoding)bVar1;
            lVar10 = 1;
            if ((char)bVar1 < '\0') {
              uVar18 = (uint)bVar1;
              cVar20 = (cram_encoding)pbVar22[3];
              if (bVar1 < 0xc0) {
                cVar20 = (uVar18 & 0x3f) << 8 | cVar20;
                lVar19 = 2;
              }
              else if (bVar1 < 0xe0) {
                cVar20 = (uVar18 & 0x1f) << 0x10 | cVar20 << 8 | (uint)pbVar22[4];
                lVar19 = 3;
              }
              else if (bVar1 < 0xf0) {
                cVar20 = (uVar18 & 0xf) << 0x18 | cVar20 << 0x10 | (uint)pbVar22[4] << 8 |
                         (uint)pbVar22[5];
                lVar19 = 4;
              }
              else {
                cVar20 = pbVar22[6] & (E_GOLOMB_RICE|E_SUBEXP) |
                         (uint)pbVar22[5] << 4 |
                         (uint)pbVar22[4] << 0xc | cVar20 << 0x14 | uVar18 << 0x1c;
                lVar19 = 5;
              }
            }
            else {
              lVar19 = 1;
            }
            bVar1 = pbVar22[lVar19 + 2];
            uVar18 = (uint)bVar1;
            if ((char)bVar1 < '\0') {
              uVar9 = (uint)bVar1;
              uVar18 = (uint)pbVar22[lVar19 + 3];
              if (bVar1 < 0xc0) {
                uVar18 = (uVar9 & 0x3f) << 8 | uVar18;
                lVar10 = 2;
              }
              else if (bVar1 < 0xe0) {
                uVar18 = (uVar9 & 0x1f) << 0x10 | uVar18 << 8 | (uint)pbVar22[lVar19 + 4];
                lVar10 = 3;
              }
              else if (bVar1 < 0xf0) {
                uVar18 = (uVar9 & 0xf) << 0x18 | uVar18 << 0x10 | (uint)pbVar22[lVar19 + 4] << 8 |
                         (uint)pbVar22[lVar19 + 5];
                lVar10 = 4;
              }
              else {
                uVar18 = pbVar22[lVar19 + 6] & 0xf |
                         (uint)pbVar22[lVar19 + 5] << 4 |
                         (uint)pbVar22[lVar19 + 4] << 0xc | uVar18 << 0x14 | uVar9 << 0x1c;
                lVar10 = 5;
              }
            }
            pbVar21 = pbVar22 + lVar10 + lVar19 + 2;
            *puVar13 = (int)(char)pbVar22[1] | (int)(char)*pbVar22 << 8;
            puVar13[1] = cVar20;
            puVar13[3] = uVar18;
            puVar13[2] = (int)pbVar21 - *(int *)&local_38->data;
            puVar13[4] = 0;
            puVar13[5] = 0;
            if (cVar20 != E_NULL) {
              bVar1 = *pbVar22;
              bVar4 = false;
              switch(bVar1) {
              case 0x41:
                if (pbVar22[1] == 0x50) {
                  pcVar14 = cram_decoder_init(cVar20,(char *)pbVar21,uVar18,E_INT,fd->version);
                  h->codecs[0x11] = pcVar14;
                  break;
                }
LAB_001412f7:
                fprintf(_stderr,"Unrecognised key: %.2s\n",pbVar22);
                goto LAB_00141381;
              case 0x42:
                if (pbVar22[1] == 0x46) {
                  pcVar14 = cram_decoder_init(cVar20,(char *)pbVar21,uVar18,E_INT,fd->version);
                  h->codecs[0xf] = pcVar14;
                }
                else {
                  bVar1 = pbVar22[1];
                  if (bVar1 == 0x41) {
                    pcVar14 = cram_decoder_init(cVar20,(char *)pbVar21,uVar18,E_BYTE,fd->version);
                    h->codecs[0x1e] = pcVar14;
                  }
                  else if (bVar1 == 0x42) {
                    pcVar14 = cram_decoder_init(cVar20,(char *)pbVar21,uVar18,E_BYTE_ARRAY,
                                                fd->version);
                    h->codecs[0x25] = pcVar14;
                  }
                  else {
                    if (bVar1 != 0x53) goto LAB_001412f7;
                    pcVar14 = cram_decoder_init(cVar20,(char *)pbVar21,uVar18,E_BYTE,fd->version);
                    h->codecs[0x1f] = pcVar14;
                  }
                }
                break;
              case 0x43:
                if (pbVar22[1] != 0x46) goto LAB_001412f7;
                pcVar14 = cram_decoder_init(cVar20,(char *)pbVar21,uVar18,E_INT,fd->version);
                h->codecs[0x10] = pcVar14;
                break;
              case 0x44:
                if (pbVar22[1] != 0x4c) goto LAB_001412f7;
                pcVar14 = cram_decoder_init(cVar20,(char *)pbVar21,uVar18,E_INT,fd->version);
                h->codecs[0x1d] = pcVar14;
                break;
              default:
switchD_00140db5_caseD_45:
                if (bVar1 == 0x48) {
                  if (pbVar22[1] != 0x43) goto LAB_0014128e;
                  pcVar14 = cram_decoder_init(cVar20,(char *)pbVar21,uVar18,E_INT,fd->version);
                  h->codecs[0x24] = pcVar14;
                }
                else if ((bVar1 == 0x50) && (pbVar22[1] == 0x44)) {
                  pcVar14 = cram_decoder_init(cVar20,(char *)pbVar21,uVar18,E_INT,fd->version);
                  h->codecs[0x23] = pcVar14;
                }
                else {
LAB_0014128e:
                  if ((bVar4) && (pbVar22[1] == 0x4e)) {
                    pcVar14 = cram_decoder_init(cVar20,(char *)pbVar21,uVar18,E_BYTE_ARRAY_BLOCK,
                                                fd->version);
                    h->codecs[0xb] = pcVar14;
                  }
                  else {
                    if (bVar1 != 0x51) goto LAB_001412f7;
                    if (pbVar22[1] == 0x51) {
                      pcVar14 = cram_decoder_init(cVar20,(char *)pbVar21,uVar18,E_BYTE_ARRAY,
                                                  fd->version);
                      h->codecs[0x26] = pcVar14;
                    }
                    else {
                      if (pbVar22[1] != 0x53) goto LAB_001412f7;
                      pcVar14 = cram_decoder_init(cVar20,(char *)pbVar21,uVar18,E_BYTE,fd->version);
                      h->codecs[0xc] = pcVar14;
                    }
                  }
                }
                break;
              case 0x46:
                bVar1 = pbVar22[1];
                if (bVar1 == 0x43) {
                  pcVar14 = cram_decoder_init(cVar20,(char *)pbVar21,uVar18,E_BYTE,fd->version);
                  h->codecs[0x1b] = pcVar14;
                }
                else if (bVar1 == 0x50) {
                  pcVar14 = cram_decoder_init(cVar20,(char *)pbVar21,uVar18,E_INT,fd->version);
                  h->codecs[0x1c] = pcVar14;
                }
                else {
                  if (bVar1 != 0x4e) goto LAB_001412f7;
                  pcVar14 = cram_decoder_init(cVar20,(char *)pbVar21,uVar18,E_INT,fd->version);
                  h->codecs[0x1a] = pcVar14;
                }
                break;
              case 0x49:
                if (pbVar22[1] != 0x4e) goto LAB_001412f7;
                pcVar14 = cram_decoder_init(cVar20,(char *)pbVar21,uVar18,E_BYTE_ARRAY,fd->version);
                h->codecs[0xd] = pcVar14;
                break;
              case 0x4d:
                if (pbVar22[1] == 0x51) {
                  pcVar14 = cram_decoder_init(cVar20,(char *)pbVar21,uVar18,E_INT,fd->version);
                  h->codecs[0x13] = pcVar14;
                }
                else {
                  if (pbVar22[1] != 0x46) goto LAB_001412f7;
                  pcVar14 = cram_decoder_init(cVar20,(char *)pbVar21,uVar18,E_INT,fd->version);
                  h->codecs[0x15] = pcVar14;
                }
                break;
              case 0x4e:
                bVar1 = pbVar22[1];
                if (bVar1 == 0x46) {
                  pcVar14 = cram_decoder_init(cVar20,(char *)pbVar21,uVar18,E_INT,fd->version);
                  h->codecs[0x18] = pcVar14;
                }
                else if (bVar1 == 0x50) {
                  pcVar14 = cram_decoder_init(cVar20,(char *)pbVar21,uVar18,E_INT,fd->version);
                  h->codecs[0x17] = pcVar14;
                }
                else {
                  if (bVar1 != 0x53) goto LAB_001412f7;
                  pcVar14 = cram_decoder_init(cVar20,(char *)pbVar21,uVar18,E_INT,fd->version);
                  h->codecs[0x14] = pcVar14;
                }
                break;
              case 0x52:
                bVar3 = pbVar22[1];
                if (bVar3 == 0x47) {
                  pcVar14 = cram_decoder_init(cVar20,(char *)pbVar21,uVar18,E_INT,fd->version);
                  h->codecs[0x12] = pcVar14;
                }
                else if (bVar3 == 0x4c) {
                  pcVar14 = cram_decoder_init(cVar20,(char *)pbVar21,uVar18,E_INT,fd->version);
                  h->codecs[0x19] = pcVar14;
                }
                else if (bVar3 == 0x49) {
                  pcVar14 = cram_decoder_init(cVar20,(char *)pbVar21,uVar18,E_INT,fd->version);
                  h->codecs[0x21] = pcVar14;
                }
                else {
                  bVar4 = true;
                  if (pbVar22[1] != 0x53) goto switchD_00140db5_caseD_45;
                  pcVar14 = cram_decoder_init(cVar20,(char *)pbVar21,uVar18,E_INT,fd->version);
                  h->codecs[0x22] = pcVar14;
                }
                break;
              case 0x53:
                if (pbVar22[1] != 0x43) goto LAB_001412f7;
                pcVar14 = cram_decoder_init(cVar20,(char *)pbVar21,uVar18,E_BYTE_ARRAY,fd->version);
                h->codecs[0xe] = pcVar14;
                break;
              case 0x54:
                bVar1 = pbVar22[1];
                if (bVar1 == 0x43) {
                  pcVar14 = cram_decoder_init(cVar20,(char *)pbVar21,uVar18,E_BYTE,fd->version);
                  h->codecs[0x2c] = pcVar14;
                }
                else if (bVar1 == 0x4e) {
                  pcVar14 = cram_decoder_init(cVar20,(char *)pbVar21,uVar18,E_INT,fd->version);
                  h->codecs[0x27] = pcVar14;
                }
                else if (bVar1 == 0x53) {
                  pcVar14 = cram_decoder_init(cVar20,(char *)pbVar21,uVar18,E_INT,fd->version);
                  h->codecs[0x16] = pcVar14;
                }
                else {
                  bVar1 = pbVar22[1];
                  if ((bVar1 == 0x56) || (bVar1 == 0x4d)) goto LAB_00141381;
                  if (bVar1 != 0x4c) goto LAB_001412f7;
                  pcVar14 = cram_decoder_init(cVar20,(char *)pbVar21,uVar18,E_INT,fd->version);
                  h->codecs[0x20] = pcVar14;
                }
              }
              if (pcVar14 == (cram_codec *)0x0) goto LAB_0014175a;
LAB_00141381:
              pbVar21 = pbVar21 + (int)uVar18;
              *(undefined8 *)(puVar13 + 6) =
                   *(undefined8 *)
                    (local_40->substitution_matrix +
                    (ulong)((uint)pbVar22[1] + (uint)*pbVar22 + (uint)*pbVar22 * 2 & 0x1f) * 2 +
                    -0xe);
              *(uint **)(local_40->substitution_matrix +
                        (ulong)((uint)pbVar22[1] + (uint)*pbVar22 + (uint)*pbVar22 * 2 & 0x1f) * 2 +
                        -0xe) = puVar13;
            }
            uVar16 = uVar16 - 1;
            pbVar22 = pbVar21;
          } while (uVar16 != 0);
        }
        if ((long)pbVar21 - (long)local_48 == (long)(int)local_50) {
          bVar1 = *pbVar21;
          uVar16 = (uint)bVar1;
          lVar10 = 1;
          if ((char)bVar1 < '\0') {
            uVar18 = (uint)bVar1;
            uVar16 = (uint)pbVar21[1];
            if (bVar1 < 0xc0) {
              uVar16 = (uVar18 & 0x3f) << 8 | uVar16;
              lVar19 = 2;
            }
            else if (bVar1 < 0xe0) {
              uVar16 = (uVar18 & 0x1f) << 0x10 | uVar16 << 8 | (uint)pbVar21[2];
              lVar19 = 3;
            }
            else if (bVar1 < 0xf0) {
              uVar16 = (uVar18 & 0xf) << 0x18 | uVar16 << 0x10 | (uint)pbVar21[2] << 8 |
                       (uint)pbVar21[3];
              lVar19 = 4;
            }
            else {
              uVar16 = pbVar21[4] & 0xf |
                       (uint)pbVar21[3] << 4 |
                       (uint)pbVar21[2] << 0xc | uVar16 << 0x14 | uVar18 << 0x1c;
              lVar19 = 5;
            }
          }
          else {
            lVar19 = 1;
          }
          local_50 = pbVar21 + lVar19;
          bVar1 = pbVar21[lVar19];
          uVar18 = (uint)bVar1;
          local_40 = (cram_block_compression_hdr *)CONCAT44(local_40._4_4_,uVar16);
          if ((char)bVar1 < '\0') {
            uVar16 = (uint)bVar1;
            uVar18 = (uint)local_50[1];
            if (bVar1 < 0xc0) {
              uVar18 = (uVar16 & 0x3f) << 8 | uVar18;
              lVar10 = 2;
            }
            else if (bVar1 < 0xe0) {
              uVar18 = (uVar16 & 0x1f) << 0x10 | uVar18 << 8 | (uint)local_50[2];
              lVar10 = 3;
            }
            else if (bVar1 < 0xf0) {
              uVar18 = (uVar16 & 0xf) << 0x18 | uVar18 << 0x10 | (uint)local_50[2] << 8 |
                       (uint)local_50[3];
              lVar10 = 4;
            }
            else {
              uVar18 = local_50[4] & 0xf |
                       (uint)local_50[3] << 4 |
                       (uint)local_50[2] << 0xc | uVar18 << 0x14 | uVar16 << 0x1c;
              lVar10 = 5;
            }
          }
          pbVar21 = local_50 + lVar10;
          pbVar22 = pbVar21;
          if (0 < (int)uVar18) {
            do {
              pcVar15 = (cram_block_compression_hdr *)malloc(0x20);
              if (pcVar15 == (cram_block_compression_hdr *)0x0) goto LAB_0014175a;
              pcVar15->ref_seq_id =
                   (int)(char)pbVar22[3] |
                   (int)(char)pbVar22[2] << 8 | (int)(char)pbVar22[1] << 0x10;
              bVar1 = pbVar22[4];
              cVar20 = (cram_encoding)bVar1;
              lVar10 = 1;
              if ((char)bVar1 < '\0') {
                uVar16 = (uint)bVar1;
                cVar20 = (cram_encoding)pbVar22[5];
                if (bVar1 < 0xc0) {
                  cVar20 = (uVar16 & 0x3f) << 8 | cVar20;
                  lVar19 = 2;
                }
                else if (bVar1 < 0xe0) {
                  cVar20 = (uVar16 & 0x1f) << 0x10 | cVar20 << 8 | (uint)pbVar22[6];
                  lVar19 = 3;
                }
                else if (bVar1 < 0xf0) {
                  cVar20 = (uVar16 & 0xf) << 0x18 | cVar20 << 0x10 | (uint)pbVar22[6] << 8 |
                           (uint)pbVar22[7];
                  lVar19 = 4;
                }
                else {
                  cVar20 = pbVar22[8] & (E_GOLOMB_RICE|E_SUBEXP) |
                           (uint)pbVar22[7] << 4 |
                           (uint)pbVar22[6] << 0xc | cVar20 << 0x14 | uVar16 << 0x1c;
                  lVar19 = 5;
                }
              }
              else {
                lVar19 = 1;
              }
              bVar1 = pbVar22[lVar19 + 4];
              uVar16 = (uint)bVar1;
              if ((char)bVar1 < '\0') {
                uVar9 = (uint)bVar1;
                uVar16 = (uint)pbVar22[lVar19 + 5];
                if (bVar1 < 0xc0) {
                  uVar16 = (uVar9 & 0x3f) << 8 | uVar16;
                  lVar10 = 2;
                }
                else if (bVar1 < 0xe0) {
                  uVar16 = (uVar9 & 0x1f) << 0x10 | uVar16 << 8 | (uint)pbVar22[lVar19 + 6];
                  lVar10 = 3;
                }
                else if (bVar1 < 0xf0) {
                  uVar16 = (uVar9 & 0xf) << 0x18 | uVar16 << 0x10 | (uint)pbVar22[lVar19 + 6] << 8 |
                           (uint)pbVar22[lVar19 + 7];
                  lVar10 = 4;
                }
                else {
                  uVar16 = pbVar22[lVar19 + 8] & 0xf |
                           (uint)pbVar22[lVar19 + 7] << 4 |
                           (uint)pbVar22[lVar19 + 6] << 0xc | uVar16 << 0x14 | uVar9 << 0x1c;
                  lVar10 = 5;
                }
              }
              pbVar21 = pbVar22 + lVar10 + lVar19 + 4;
              pcVar15->ref_seq_start = cVar20;
              pcVar15->num_records = uVar16;
              pcVar15->ref_seq_span = (int)pbVar21 - *(int *)&local_38->data;
              pcVar14 = cram_decoder_init(cVar20,(char *)pbVar21,uVar16,E_BYTE_ARRAY_BLOCK,
                                          fd->version);
              *(cram_codec **)&pcVar15->num_landmarks = pcVar14;
              if (pcVar14 == (cram_codec *)0x0) {
                cram_free_compression_header(h);
                h = pcVar15;
                goto LAB_0014043c;
              }
              pbVar21 = pbVar21 + (int)uVar16;
              pcVar15->landmark =
                   &h->tag_encoding_map
                    [(uint)pbVar22[2] + (uint)pbVar22[1] + (uint)pbVar22[1] * 2 & 0x1f]->key;
              h->tag_encoding_map[(uint)pbVar22[2] + (uint)pbVar22[1] + (uint)pbVar22[1] * 2 & 0x1f]
                   = (cram_map *)pcVar15;
              uVar18 = uVar18 - 1;
              pbVar22 = pbVar21;
            } while (uVar18 != 0);
          }
          if ((long)pbVar21 - (long)local_50 == (long)(int)local_40) {
            return h;
          }
        }
      }
    }
LAB_0014175a:
    cram_free_compression_header(h);
  }
  else {
LAB_0014043c:
    free(h);
  }
  return (cram_block_compression_hdr *)0x0;
}

Assistant:

cram_block_compression_hdr *cram_decode_compression_header(cram_fd *fd,
							   cram_block *b) {
    char *cp, *cp_copy;
    cram_block_compression_hdr *hdr = calloc(1, sizeof(*hdr));
    int i;
    int32_t map_size, map_count;

    if (!hdr)
	return NULL;

    if (b->method != RAW) {
	if (cram_uncompress_block(b)) {
	    free(hdr);
	    return NULL;
	}
    }

    cp = (char *)b->data;

    if (CRAM_MAJOR_VERS(fd->version) == 1) {
	cp += itf8_get(cp, &hdr->ref_seq_id);
	cp += itf8_get(cp, &hdr->ref_seq_start);
	cp += itf8_get(cp, &hdr->ref_seq_span);
	cp += itf8_get(cp, &hdr->num_records);
	cp += itf8_get(cp, &hdr->num_landmarks);
	if (!(hdr->landmark = malloc(hdr->num_landmarks * sizeof(int32_t)))) {
	    free(hdr);
	    return NULL;
	}
	for (i = 0; i < hdr->num_landmarks; i++) {
	    cp += itf8_get(cp, &hdr->landmark[i]);
	}
    }

    hdr->preservation_map = kh_init(map);

    memset(hdr->rec_encoding_map, 0,
	   CRAM_MAP_HASH * sizeof(hdr->rec_encoding_map[0]));
    memset(hdr->tag_encoding_map, 0,
	   CRAM_MAP_HASH * sizeof(hdr->tag_encoding_map[0]));

    if (!hdr->preservation_map) {
	cram_free_compression_header(hdr);
	return NULL;
    }

    /* Initialise defaults for preservation map */
    hdr->mapped_qs_included = 0;
    hdr->unmapped_qs_included = 0;
    hdr->unmapped_placed = 0;
    hdr->qs_included = 0;
    hdr->read_names_included = 0;
    hdr->AP_delta = 1;
    memcpy(hdr->substitution_matrix, "CGTNAGTNACTNACGNACGT", 20);

    /* Preservation map */
    cp += itf8_get(cp, &map_size); cp_copy = cp;
    cp += itf8_get(cp, &map_count);
    for (i = 0; i < map_count; i++) {
	pmap_t hd;
	khint_t k;
	int r;

	cp += 2;
	switch(CRAM_KEY(cp[-2],cp[-1])) {
	case CRAM_KEY('M','I'):
	    hd.i = *cp++;
	    k = kh_put(map, hdr->preservation_map, "MI", &r);
	    if (-1 == r) {
		cram_free_compression_header(hdr);
                return NULL;
            }

	    kh_val(hdr->preservation_map, k) = hd;
	    hdr->mapped_qs_included = hd.i;
	    break;

	case CRAM_KEY('U','I'):
	    hd.i = *cp++;
	    k = kh_put(map, hdr->preservation_map, "UI", &r);
	    if (-1 == r) {
		cram_free_compression_header(hdr);
                return NULL;
            }

	    kh_val(hdr->preservation_map, k) = hd;
	    hdr->unmapped_qs_included = hd.i;
	    break;

	case CRAM_KEY('P','I'):
	    hd.i = *cp++;
	    k = kh_put(map, hdr->preservation_map, "PI", &r);
	    if (-1 == r) {
		cram_free_compression_header(hdr);
                return NULL;
            }

	    kh_val(hdr->preservation_map, k) = hd;
	    hdr->unmapped_placed = hd.i;
	    break;

	case CRAM_KEY('R','N'):
	    hd.i = *cp++;
	    k = kh_put(map, hdr->preservation_map, "RN", &r);
	    if (-1 == r) {
		cram_free_compression_header(hdr);
                return NULL;
            }

	    kh_val(hdr->preservation_map, k) = hd;
	    hdr->read_names_included = hd.i;
	    break;

	case CRAM_KEY('A','P'):
	    hd.i = *cp++;
	    k = kh_put(map, hdr->preservation_map, "AP", &r);
	    if (-1 == r) {
		cram_free_compression_header(hdr);
                return NULL;
            }

	    kh_val(hdr->preservation_map, k) = hd;
	    hdr->AP_delta = hd.i;
	    break;

	case CRAM_KEY('R','R'):
	    hd.i = *cp++;
	    k = kh_put(map, hdr->preservation_map, "RR", &r);
	    if (-1 == r) {
		cram_free_compression_header(hdr);
                return NULL;
            }

	    kh_val(hdr->preservation_map, k) = hd;
	    fd->no_ref = !hd.i;
	    break;

	case CRAM_KEY('S','M'):
	    hdr->substitution_matrix[0][(cp[0]>>6)&3] = 'C';
	    hdr->substitution_matrix[0][(cp[0]>>4)&3] = 'G';
	    hdr->substitution_matrix[0][(cp[0]>>2)&3] = 'T';
	    hdr->substitution_matrix[0][(cp[0]>>0)&3] = 'N';

	    hdr->substitution_matrix[1][(cp[1]>>6)&3] = 'A';
	    hdr->substitution_matrix[1][(cp[1]>>4)&3] = 'G';
	    hdr->substitution_matrix[1][(cp[1]>>2)&3] = 'T';
	    hdr->substitution_matrix[1][(cp[1]>>0)&3] = 'N';

	    hdr->substitution_matrix[2][(cp[2]>>6)&3] = 'A';
	    hdr->substitution_matrix[2][(cp[2]>>4)&3] = 'C';
	    hdr->substitution_matrix[2][(cp[2]>>2)&3] = 'T';
	    hdr->substitution_matrix[2][(cp[2]>>0)&3] = 'N';

	    hdr->substitution_matrix[3][(cp[3]>>6)&3] = 'A';
	    hdr->substitution_matrix[3][(cp[3]>>4)&3] = 'C';
	    hdr->substitution_matrix[3][(cp[3]>>2)&3] = 'G';
	    hdr->substitution_matrix[3][(cp[3]>>0)&3] = 'N';

	    hdr->substitution_matrix[4][(cp[4]>>6)&3] = 'A';
	    hdr->substitution_matrix[4][(cp[4]>>4)&3] = 'C';
	    hdr->substitution_matrix[4][(cp[4]>>2)&3] = 'G';
	    hdr->substitution_matrix[4][(cp[4]>>0)&3] = 'T';

	    hd.p = cp;
	    cp += 5;

	    k = kh_put(map, hdr->preservation_map, "SM", &r);
	    if (-1 == r) {
		cram_free_compression_header(hdr);
		return NULL;
	    }
	    kh_val(hdr->preservation_map, k) = hd;
	    break;

	case CRAM_KEY('T','D'): {
	    int sz = cram_decode_TD(cp, hdr); // tag dictionary
	    if (sz < 0) {
		cram_free_compression_header(hdr);
		return NULL;
	    }

	    hd.p = cp;
	    cp += sz;

	    k = kh_put(map, hdr->preservation_map, "TD", &r);
	    if (-1 == r) {
		cram_free_compression_header(hdr);
		return NULL;
	    }
	    kh_val(hdr->preservation_map, k) = hd;
	    break;
	}

	default:
	    fprintf(stderr, "Unrecognised preservation map key %c%c\n",
		    cp[-2], cp[-1]);
	    // guess byte;
	    cp++;
	    break;
	}
    }
    if (cp - cp_copy != map_size) {
	cram_free_compression_header(hdr);
	return NULL;
    }

    /* Record encoding map */
    cp += itf8_get(cp, &map_size); cp_copy = cp;
    cp += itf8_get(cp, &map_count);
    for (i = 0; i < map_count; i++) {
	char *key = cp;
	int32_t encoding;
	int32_t size;
	cram_map *m = malloc(sizeof(*m)); // FIXME: use pooled_alloc

	if (!m) {
	    cram_free_compression_header(hdr);
	    return NULL;
	}

	cp += 2;
	cp += itf8_get(cp, &encoding);
	cp += itf8_get(cp, &size);

	// Fill out cram_map purely for cram_dump to dump out.
	m->key = (key[0]<<8)|key[1];
	m->encoding = encoding;
	m->size     = size;
	m->offset   = cp - (char *)b->data;
	m->codec = NULL;

	if (m->encoding == E_NULL)
	    continue;

	//printf("%s codes for %.2s\n", cram_encoding2str(encoding), key);

	/*
	 * For CRAM1.0 CF and BF are Byte and not Int.
	 * Practically speaking it makes no difference unless we have a
	 * 1.0 format file that stores these in EXTERNAL as only then
	 * does Byte vs Int matter.
	 *
	 * Neither this C code nor Java reference implementations did this,
	 * so we gloss over it and treat them as int.
	 */

	if (key[0] == 'B' && key[1] == 'F') {
	    if (!(hdr->codecs[DS_BF] = cram_decoder_init(encoding, cp, size,
							 E_INT,
							 fd->version))) {
		cram_free_compression_header(hdr);
		return NULL;
	    }
	} else if (key[0] == 'C' && key[1] == 'F') {
	    if (!(hdr->codecs[DS_CF] = cram_decoder_init(encoding, cp, size,
							 E_INT,
							 fd->version))) {
		cram_free_compression_header(hdr);
		return NULL;
	    }
	} else if (key[0] == 'R' && key[1] == 'I') {
	    if (!(hdr->codecs[DS_RI] = cram_decoder_init(encoding, cp, size,
							 E_INT,
							 fd->version))) {
		cram_free_compression_header(hdr);
		return NULL;
	    }
	} else if (key[0] == 'R' && key[1] == 'L') {
	    if (!(hdr->codecs[DS_RL] = cram_decoder_init(encoding, cp, size,
							 E_INT,
							 fd->version))) {
		cram_free_compression_header(hdr);
		return NULL;
	    }
	} else if (key[0] == 'A' && key[1] == 'P') {
	    if (!(hdr->codecs[DS_AP] = cram_decoder_init(encoding, cp, size,
							 E_INT,
							 fd->version))) {
		cram_free_compression_header(hdr);
		return NULL;
	    }
	} else if (key[0] == 'R' && key[1] == 'G') {
	    if (!(hdr->codecs[DS_RG] = cram_decoder_init(encoding, cp, size,
							 E_INT,
							 fd->version))) {
		cram_free_compression_header(hdr);
		return NULL;
	    }
	} else if (key[0] == 'M' && key[1] == 'F') {
	    if (!(hdr->codecs[DS_MF] = cram_decoder_init(encoding, cp, size,
							 E_INT,
							 fd->version))) {
		cram_free_compression_header(hdr);
		return NULL;
	    }
	} else if (key[0] == 'N' && key[1] == 'S') {
	    if (!(hdr->codecs[DS_NS] = cram_decoder_init(encoding, cp, size,
							 E_INT,
							 fd->version))) {
		cram_free_compression_header(hdr);
		return NULL;
	    }
	} else if (key[0] == 'N' && key[1] == 'P') {
	    if (!(hdr->codecs[DS_NP] = cram_decoder_init(encoding, cp, size,
							 E_INT,
							 fd->version))) {
		cram_free_compression_header(hdr);
		return NULL;
	    }
	} else if (key[0] == 'T' && key[1] == 'S') {
	    if (!(hdr->codecs[DS_TS] = cram_decoder_init(encoding, cp, size,
							 E_INT,
							 fd->version))) {
		cram_free_compression_header(hdr);
		return NULL;
	    }
	} else if (key[0] == 'N' && key[1] == 'F') {
	    if (!(hdr->codecs[DS_NF] = cram_decoder_init(encoding, cp, size,
							 E_INT,
							 fd->version))) {
		cram_free_compression_header(hdr);
		return NULL;
	    }
	} else if (key[0] == 'T' && key[1] == 'C') {
	    if (!(hdr->codecs[DS_TC] = cram_decoder_init(encoding, cp, size,
							 E_BYTE,
							 fd->version))) {
		cram_free_compression_header(hdr);
		return NULL;
	    }
	} else if (key[0] == 'T' && key[1] == 'N') {
	    if (!(hdr->codecs[DS_TN] = cram_decoder_init(encoding, cp, size,
							 E_INT,
							 fd->version))) {
		cram_free_compression_header(hdr);
		return NULL;
	    }
	} else if (key[0] == 'F' && key[1] == 'N') {
	    if (!(hdr->codecs[DS_FN] = cram_decoder_init(encoding, cp, size,
							 E_INT,
							 fd->version))) {
		cram_free_compression_header(hdr);
		return NULL;
	    }
	} else if (key[0] == 'F' && key[1] == 'C') {
	    if (!(hdr->codecs[DS_FC] = cram_decoder_init(encoding, cp, size,
							 E_BYTE,
							 fd->version))) {
		cram_free_compression_header(hdr);
		return NULL;
	    }
	} else if (key[0] == 'F' && key[1] == 'P') {
	    if (!(hdr->codecs[DS_FP] = cram_decoder_init(encoding, cp, size,
							 E_INT,
							 fd->version))) {
		cram_free_compression_header(hdr);
		return NULL;
	    }
	} else if (key[0] == 'B' && key[1] == 'S') {
	    if (!(hdr->codecs[DS_BS] = cram_decoder_init(encoding, cp, size,
							 E_BYTE,
							 fd->version))) {
		cram_free_compression_header(hdr);
		return NULL;
	    }
	} else if (key[0] == 'I' && key[1] == 'N') {
	    if (!(hdr->codecs[DS_IN] = cram_decoder_init(encoding, cp, size,
							 E_BYTE_ARRAY,
							 fd->version))) {
		cram_free_compression_header(hdr);
		return NULL;
	    }
	} else if (key[0] == 'S' && key[1] == 'C') {
	    if (!(hdr->codecs[DS_SC] = cram_decoder_init(encoding, cp, size,
							 E_BYTE_ARRAY,
							 fd->version))) {
		cram_free_compression_header(hdr);
		return NULL;
	    }
	} else if (key[0] == 'D' && key[1] == 'L') {
	    if (!(hdr->codecs[DS_DL] = cram_decoder_init(encoding, cp, size,
							 E_INT,
							 fd->version))) {
		cram_free_compression_header(hdr);
		return NULL;
	    }
	} else if (key[0] == 'B' && key[1] == 'A') {
	    if (!(hdr->codecs[DS_BA] = cram_decoder_init(encoding, cp, size,
							 E_BYTE,
							 fd->version))) {
		cram_free_compression_header(hdr);
		return NULL;
	    }
	} else if (key[0] == 'B' && key[1] == 'B') {
	    if (!(hdr->codecs[DS_BB] = cram_decoder_init(encoding, cp, size,
							 E_BYTE_ARRAY,
							 fd->version))) {
		cram_free_compression_header(hdr);
		return NULL;
	    }
	} else if (key[0] == 'R' && key[1] == 'S') {
	    if (!(hdr->codecs[DS_RS] = cram_decoder_init(encoding, cp, size,
							 E_INT,
							 fd->version))) {
		cram_free_compression_header(hdr);
		return NULL;
	    }
	} else if (key[0] == 'P' && key[1] == 'D') {
	    if (!(hdr->codecs[DS_PD] = cram_decoder_init(encoding, cp, size,
							 E_INT,
							 fd->version))) {
		cram_free_compression_header(hdr);
		return NULL;
	    }
	} else if (key[0] == 'H' && key[1] == 'C') {
	    if (!(hdr->codecs[DS_HC] = cram_decoder_init(encoding, cp, size,
							 E_INT,
							 fd->version))) {
		cram_free_compression_header(hdr);
		return NULL;
	    }
	} else if (key[0] == 'M' && key[1] == 'Q') {
	    if (!(hdr->codecs[DS_MQ] = cram_decoder_init(encoding, cp, size,
							 E_INT,
							 fd->version))) {
		cram_free_compression_header(hdr);
		return NULL;
	    }
	} else if (key[0] == 'R' && key[1] == 'N') {
	    if (!(hdr->codecs[DS_RN] = cram_decoder_init(encoding, cp, size,
							 E_BYTE_ARRAY_BLOCK,
							 fd->version))) {
		cram_free_compression_header(hdr);
		return NULL;
	    }
	} else if (key[0] == 'Q' && key[1] == 'S') {
	    if (!(hdr->codecs[DS_QS] = cram_decoder_init(encoding, cp, size,
							 E_BYTE,
							 fd->version))) {
		cram_free_compression_header(hdr);
		return NULL;
	    }
	} else if (key[0] == 'Q' && key[1] == 'Q') {
	    if (!(hdr->codecs[DS_QQ] = cram_decoder_init(encoding, cp, size,
							 E_BYTE_ARRAY,
							 fd->version))) {
		cram_free_compression_header(hdr);
		return NULL;
	    }
	} else if (key[0] == 'T' && key[1] == 'L') {
	    if (!(hdr->codecs[DS_TL] = cram_decoder_init(encoding, cp, size,
							 E_INT,
							 fd->version))) {
		cram_free_compression_header(hdr);
		return NULL;
	    }
	} else if (key[0] == 'T' && key[1] == 'M') {
	} else if (key[0] == 'T' && key[1] == 'V') {
	} else
	    fprintf(stderr, "Unrecognised key: %.2s\n", key);

	cp += size;

	m->next = hdr->rec_encoding_map[CRAM_MAP(key[0], key[1])];
	hdr->rec_encoding_map[CRAM_MAP(key[0], key[1])] = m;
    }
    if (cp - cp_copy != map_size) {
	cram_free_compression_header(hdr);
	return NULL;
    }

    /* Tag encoding map */
    cp += itf8_get(cp, &map_size); cp_copy = cp;
    cp += itf8_get(cp, &map_count);
    for (i = 0; i < map_count; i++) {
	int32_t encoding;
	int32_t size;
	cram_map *m = malloc(sizeof(*m)); // FIXME: use pooled_alloc
	char *key = cp+1;

	if (!m) {
	    cram_free_compression_header(hdr);
	    return NULL;
	}

	m->key = (key[0]<<16)|(key[1]<<8)|key[2];

	cp += 4; // Strictly ITF8, but this suffices
	cp += itf8_get(cp, &encoding);
	cp += itf8_get(cp, &size);

	m->encoding = encoding;
	m->size     = size;
	m->offset   = cp - (char *)b->data;
	if (!(m->codec = cram_decoder_init(encoding, cp, size,
					   E_BYTE_ARRAY_BLOCK, fd->version))) {
	    cram_free_compression_header(hdr);
	    free(m);
	    return NULL;
	}
	
	cp += size;

	m->next = hdr->tag_encoding_map[CRAM_MAP(key[0],key[1])];
	hdr->tag_encoding_map[CRAM_MAP(key[0],key[1])] = m;
    }
    if (cp - cp_copy != map_size) {
	cram_free_compression_header(hdr);
	return NULL;
    }

    return hdr;
}